

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

int FmsDataCollectionAddField(FmsDataCollection dc,char *field_name,FmsField *field)

{
  ulong uVar1;
  int iVar2;
  FmsInt FVar3;
  FmsField *ppFVar4;
  FmsField str_copy_p;
  int iVar5;
  
  if (dc == (FmsDataCollection)0x0) {
    iVar5 = 1;
  }
  else if (field == (FmsField *)0x0) {
    iVar5 = 2;
  }
  else {
    uVar1 = dc->num_fields;
    FVar3 = NextPow2(uVar1 + 1);
    iVar5 = 3;
    if (uVar1 <= FVar3 >> 1) {
      ppFVar4 = (FmsField *)realloc(dc->fields,FVar3 << 3);
      if (ppFVar4 == (FmsField *)0x0) {
        return 3;
      }
      dc->fields = ppFVar4;
    }
    str_copy_p = (FmsField)calloc(1,0x30);
    if (str_copy_p != (FmsField)0x0) {
      iVar2 = FmsCopyString(field_name,(char **)str_copy_p);
      if (iVar2 == 0) {
        dc->num_fields = uVar1 + 1;
        dc->fields[uVar1] = str_copy_p;
        *field = str_copy_p;
        iVar5 = 0;
      }
      else {
        free(str_copy_p);
      }
    }
  }
  return iVar5;
}

Assistant:

int FmsDataCollectionAddField(FmsDataCollection dc, const char *field_name,
                              FmsField *field) {
  if (!dc) { E_RETURN(1); }
  if (!field) { E_RETURN(2); }
  const FmsInt num_fields = dc->num_fields;
  FmsField *fields = dc->fields;
  // Reallocate dc->fields, if necessary
  const FmsInt nc = NextPow2(num_fields + 1);
  if (num_fields <= nc/2) {
    fields = realloc(fields, nc*sizeof(*fields));
    if (fields == NULL) { E_RETURN(3); }
    dc->fields = fields;
  }
  FmsField new_field;
  new_field = calloc(1, sizeof(*new_field));
  if (new_field == NULL) { E_RETURN(3); }
  // On error, call free(new_field)
  if (FmsCopyString(field_name, &new_field->name)) {
    free(new_field); E_RETURN(3);
  }
  // Update the field
  dc->num_fields = num_fields + 1;
  dc->fields[num_fields] = new_field;
  *field = new_field;
  return 0;
}